

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  byte bVar1;
  pointer names_00;
  pointer ppNVar2;
  byte *pbVar3;
  bool bVar4;
  ValueType integerType;
  undefined4 in_register_00000014;
  byte *pbVar5;
  byte *in_00;
  Value *current;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *local_88;
  undefined8 local_80;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> local_78;
  Reference *local_58;
  size_t *local_50;
  ulong local_48;
  Value *local_40;
  Reference **local_38;
  
  local_80 = CONCAT44(in_register_00000014,type);
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  pbVar5 = (byte *)in;
  if (in != end && in != (char *)0x0) {
    do {
      in = (char *)pbVar5;
      if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
      break;
      pbVar5 = (byte *)in + 1;
      in = end;
    } while (pbVar5 != (byte *)end);
    if ((in != end) && (*in == 0x7b)) {
      pbVar5 = (byte *)in + 1;
      if ((pbVar5 != (byte *)end) && (*pbVar5 != 0x7d)) {
        local_40 = (Value *)0x0;
        local_48 = (ulong)(uint)(type + ddl_int8);
        local_50 = numValues;
        local_38 = refs;
LAB_0015c2ed:
        local_88 = (Value *)0x0;
        do {
          in_00 = pbVar5;
          if ((0x2c < (ulong)*pbVar5) || ((0x100100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
          break;
          pbVar5 = pbVar5 + 1;
          in_00 = (byte *)end;
        } while (pbVar5 != (byte *)end);
        if (0xe < (uint)local_48) goto switchD_0015c327_caseD_15c56e;
        integerType = (ValueType)local_80;
        switch((long)&switchD_0015c327::switchdataD_0016c690 +
               (long)(int)(&switchD_0015c327::switchdataD_0016c690)[local_48]) {
        case 0x15c329:
LAB_0015c337:
          in_00 = (byte *)parseIntegerLiteral((char *)in_00,end,&local_88,integerType);
          break;
        case 0x15c341:
LAB_0015c34f:
          in_00 = (byte *)parseFloatingLiteral((char *)in_00,end,&local_88,integerType);
          break;
        case 0x15c359:
          pbVar5 = in_00;
          if (in_00 != (byte *)end) {
            pbVar5 = in_00 + (*in_00 == 0x2d);
          }
          bVar4 = false;
          do {
            bVar1 = *pbVar5;
            if ((((bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                (bVar1 == 0x7d)) || ((pbVar5 == (byte *)end || (bVar1 == 0x29)))) {
              if (bVar4) {
                integerType = ddl_int32;
                goto LAB_0015c337;
              }
              break;
            }
            if ((char)bVar1 < '\0') break;
            pbVar5 = pbVar5 + 1;
            bVar4 = true;
          } while (chartype_table[bVar1] == '\x01');
          pbVar5 = in_00;
          if (in_00 != (byte *)end) {
            pbVar5 = in_00 + (*in_00 == 0x2d);
          }
          bVar4 = false;
          pbVar3 = pbVar5;
          while( true ) {
            pbVar3 = pbVar3 + 1;
            bVar1 = *pbVar5;
            if (((bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
               (bVar1 == 0x7d)) goto LAB_0015c54b;
            if ((pbVar5 == (byte *)end) || (bVar1 == 0x29)) break;
            if (bVar1 == 0x2e) {
              bVar4 = true;
              goto LAB_0015c4f4;
            }
            if (((char)bVar1 < '\0') || (chartype_table[bVar1] != '\x01')) goto LAB_0015c54b;
            pbVar5 = pbVar5 + 1;
            bVar4 = true;
          }
          if (bVar1 == 0x2e) goto LAB_0015c4f4;
          goto LAB_0015c54b;
        case 0x15c3c5:
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (Name **)0x0;
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (Name **)0x0;
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          in_00 = (byte *)parseReference((char *)in_00,end,&local_78);
          ppNVar2 = local_78.
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          names_00 = local_78.
                     super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_58 = (Reference *)operator_new(0x10);
            Reference::Reference(local_58,(long)ppNVar2 - (long)names_00 >> 3,names_00);
            *local_38 = local_58;
            *numRefs = (long)local_78.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
          numValues = local_50;
          if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (Name **)0x0) {
            operator_delete(local_78.
                            super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          break;
        case 0x15c55d:
          goto switchD_0015c327_caseD_15c55d;
        }
        goto switchD_0015c327_caseD_15c56e;
      }
LAB_0015c2b0:
      in = (char *)(pbVar5 + (pbVar5 != (byte *)end));
    }
  }
  return (char *)(byte *)in;
  while( true ) {
    if ((char)bVar1 < '\0') break;
    pbVar3 = pbVar3 + 1;
    bVar4 = true;
    if (chartype_table[bVar1] != '\x01') break;
LAB_0015c4f4:
    bVar1 = *pbVar3;
    if ((((bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
        (bVar1 == 0x7d)) || ((pbVar3 == (byte *)end || (bVar1 == 0x29)))) {
      if (bVar4) {
        integerType = ddl_float;
        goto LAB_0015c34f;
      }
      break;
    }
  }
LAB_0015c54b:
  if (*in_00 == 0x30) {
    if ((in_00 + 1 != (byte *)end) && ((in_00[1] + 0xa8 & 0xdf) == 0)) {
      in_00 = (byte *)parseHexaLiteral((char *)in_00,end,&local_88);
    }
  }
  else if (*in_00 == 0x22) {
switchD_0015c327_caseD_15c55d:
    in_00 = (byte *)parseStringLiteral((char *)in_00,end,&local_88);
  }
switchD_0015c327_caseD_15c56e:
  pbVar5 = in_00;
  if (local_88 != (Value *)0x0) {
    if (*data == (Value *)0x0) {
      *data = local_88;
    }
    else {
      Value::setNext(local_40,local_88);
    }
    *numValues = *numValues + 1;
    local_40 = local_88;
  }
  for (; in_00 != (byte *)end; in_00 = in_00 + 1) {
    bVar1 = *in_00;
    pbVar5 = in_00;
    if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
    break;
    pbVar5 = (byte *)end;
  }
  if (((pbVar5 == (byte *)end) || (0x2c < (ulong)*pbVar5)) ||
     ((0x100100000200U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) goto LAB_0015c2b0;
  goto LAB_0015c2ed;
}

Assistant:

char *OpenDDLParser::parseDataList(char *in, char *end, Value::ValueType type, Value **data,
        size_t &numValues, Reference **refs, size_t &numRefs) {
    *data = nullptr;
    numValues = numRefs = 0;
    if (nullptr == in || in == end) {
        return in;
    }

    in = lookForNextToken(in, end);
    if (in != end && *in == '{') {
        ++in;
        Value *current(nullptr), *prev(nullptr);
        while (in != end && '}' != *in) {
            current = nullptr;
            in = lookForNextToken(in, end);
            if (Value::ValueType::ddl_ref == type) {
                std::vector<Name *> names;
                in = parseReference(in, end, names);
                if (!names.empty()) {
                    Reference *ref = new Reference(names.size(), &names[0]);
                    *refs = ref;
                    numRefs = names.size();
                }
            } else if (Value::ValueType::ddl_none == type) {
                if (isInteger(in, end)) {
                    in = parseIntegerLiteral(in, end, &current);
                } else if (isFloat(in, end)) {
                    in = parseFloatingLiteral(in, end, &current);
                } else if (isStringLiteral(*in)) {
                    in = parseStringLiteral(in, end, &current);
                } else if (isHexLiteral(in, end)) {
                    in = parseHexaLiteral(in, end, &current);
                }
            } else {
                switch (type) {
                    case Value::ValueType::ddl_int8:
                    case Value::ValueType::ddl_int16:
                    case Value::ValueType::ddl_int32:
                    case Value::ValueType::ddl_int64:
                    case Value::ValueType::ddl_unsigned_int8:
                    case Value::ValueType::ddl_unsigned_int16:
                    case Value::ValueType::ddl_unsigned_int32:
                    case Value::ValueType::ddl_unsigned_int64:
                        in = parseIntegerLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_half:
                    case Value::ValueType::ddl_float:
                    case Value::ValueType::ddl_double:
                        in = parseFloatingLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_string:
                        in = parseStringLiteral(in, end, &current);
                        break;
                    default:
                        break;
                }
            }

            if (nullptr != current) {
                if (nullptr == *data) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext(current);
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator(in, end);
            if (in == end || (',' != *in && Grammar::CloseBracketToken[0] != *in && !isSpace(*in))) {
                break;
            }
        }
        if (in != end)
            ++in;
    }

    return in;
}